

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Vec4i __thiscall embree::XMLLoader::load<embree::Vec4<int>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  runtime_error *this_00;
  long *in_RDX;
  int *in_RDI;
  Vec4i VVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Token *in_stack_ffffffffffffff60;
  string local_90 [32];
  long *local_70;
  long *local_58;
  long *local_50;
  ParseLocation *in_stack_ffffffffffffffb8;
  
  local_70 = in_RDX;
  sVar5 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
  if (sVar5 != 4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_70;
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffffb8);
    std::operator+(__lhs,(char *)this_00);
    std::runtime_error::runtime_error(this_00,local_90);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_70 + 0x98),0);
  iVar1 = Token::Int(in_stack_ffffffffffffff60);
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_70 + 0x98),1);
  iVar2 = Token::Int(in_stack_ffffffffffffff60);
  local_50 = local_70;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_70 + 0x98),2);
  iVar3 = Token::Int(in_stack_ffffffffffffff60);
  local_58 = local_70;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_70 + 0x98),3);
  iVar4 = Token::Int(in_stack_ffffffffffffff60);
  *in_RDI = iVar1;
  in_RDI[1] = iVar2;
  in_RDI[2] = iVar3;
  in_RDI[3] = iVar4;
  VVar6.field_0.field_0.z = iVar4;
  VVar6.field_0._0_8_ = in_RDI;
  VVar6.field_0.field_0.w = 0;
  return (Vec4i)VVar6.field_0;
}

Assistant:

Vec4i XMLLoader::load<Vec4i>(const Ref<XML>& xml) {
    if (xml->body.size() != 4) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong int4 body");
    return Vec4i(xml->body[0].Int(),xml->body[1].Int(),xml->body[2].Int(),xml->body[3].Int());
  }